

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O0

int Fl_Text_Editor::kf_shift_move(int c,Fl_Text_Editor *e)

{
  int pos;
  Fl_Text_Buffer *this;
  EVP_PKEY_CTX *dst;
  size_t sVar1;
  char *copy;
  Fl_Text_Editor *e_local;
  int c_local;
  
  kf_move(c,e);
  pos = Fl_Text_Display::insert_position(&e->super_Fl_Text_Display);
  fl_text_drag_me(pos,&e->super_Fl_Text_Display);
  this = Fl_Text_Display::buffer(&e->super_Fl_Text_Display);
  dst = (EVP_PKEY_CTX *)Fl_Text_Buffer::selection_text(this);
  if (dst != (EVP_PKEY_CTX *)0x0) {
    sVar1 = strlen((char *)dst);
    Fl::copy(dst,(EVP_PKEY_CTX *)(sVar1 & 0xffffffff));
    free(dst);
  }
  return 1;
}

Assistant:

int Fl_Text_Editor::kf_shift_move(int c, Fl_Text_Editor* e) {
  kf_move(c, e);
  fl_text_drag_me(e->insert_position(), e);
  char *copy = e->buffer()->selection_text();
  if (copy) {
    Fl::copy(copy, (int) strlen(copy), 0);
    free(copy);
    }
  return 1;
}